

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

void __thiscall Color::Color(Color *this,double red,double green,double blue)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (int)green;
  iVar2 = (int)red;
  if ((int)red < 1) {
    iVar2 = 0;
  }
  uVar1 = (uchar)iVar2;
  if (0xfe < iVar2) {
    uVar1 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  iVar2 = 0;
  if (0 < (int)blue) {
    iVar2 = (int)blue;
  }
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  this->r = uVar1;
  this->g = (uchar)iVar3;
  this->b = (uchar)iVar2;
  return;
}

Assistant:

Color::Color(double red, double green, double blue) {
    int r,g,b;
    r = red;
    g = green;
    b = blue;
    clamp(r, g, b);

    this->r = r;
    this->g = g;
    this->b = b;

}